

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

bool baryonyx::itm::
     affect<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
               (solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,
               double delta)

{
  double dVar1;
  int iVar2;
  rc_data *prVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 in_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM1_Qb;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pdVar13 = (slv->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl;
  dVar1 = pdVar13[k];
  if (selected < 0) {
    if (r_size != 0) {
      auVar18._0_8_ = kappa / (1.0 - kappa);
      auVar18._8_8_ = in_XMM0_Qb;
      auVar5._8_8_ = in_XMM1_Qb;
      auVar5._0_8_ = delta;
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           ((slv->R)._M_t.
            super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
           ._M_head_impl)->value * 0.5;
      auVar5 = vfmadd213sd_fma(auVar22,auVar18,auVar5);
      lVar14 = 0;
      do {
        prVar3 = (slv->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                 ._M_head_impl;
        iVar2 = *(int *)((long)&prVar3->id + lVar14);
        if (*(int *)((long)&prVar3->f + lVar14) < 0) {
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          lVar11 = (long)it[iVar2].value;
          pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl;
          dVar20 = auVar5._0_8_ + pdVar13[lVar11];
        }
        else {
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
          lVar11 = (long)it[iVar2].value;
          pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl;
          dVar20 = pdVar13[lVar11] - auVar5._0_8_;
        }
        pdVar13[lVar11] = dVar20;
        lVar14 = lVar14 + 0x10;
      } while ((ulong)(uint)r_size << 4 != lVar14);
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar3 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
             ._M_head_impl;
    uVar16 = (ulong)(selected + 1U);
    pdVar13[k] = (prVar3[(uint)selected].value + prVar3[uVar16].value) * 0.5 + dVar1;
    auVar17._0_8_ = kappa / (1.0 - kappa);
    auVar17._8_8_ = in_XMM0_Qb;
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = delta;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = prVar3[uVar16].value - prVar3[(uint)selected].value;
    auVar5 = vfmadd213sd_fma(auVar21,auVar17,auVar6);
    dVar20 = auVar5._0_8_;
    lVar14 = 0xc;
    uVar15 = 0;
    do {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->value + lVar14);
      if (*(int *)((long)prVar3 + lVar14 + -4) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar4 = pdVar13[lVar11] - dVar20;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar4 = dVar20 + pdVar13[lVar11];
      }
      pdVar13[lVar11] = dVar4;
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x10;
    } while (uVar16 != uVar15);
    if (r_size != (int)uVar15) {
      lVar11 = (uint)r_size - uVar15;
      do {
        prVar3 = (slv->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                 ._M_head_impl;
        iVar2 = *(int *)((long)&prVar3->value + lVar14);
        if (*(int *)((long)prVar3 + lVar14 + -4) < 0) {
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          lVar12 = (long)it[iVar2].value;
          pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl;
          dVar4 = dVar20 + pdVar13[lVar12];
        }
        else {
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
          lVar12 = (long)it[iVar2].value;
          pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl;
          dVar4 = pdVar13[lVar12] - dVar20;
        }
        pdVar13[lVar12] = dVar4;
        lVar14 = lVar14 + 0x10;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  else if (r_size != 0) {
    auVar19._0_8_ = kappa / (1.0 - kappa);
    auVar19._8_8_ = in_XMM0_Qb;
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = delta;
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (slv->R)._M_t.
         super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
         .
         super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
         ._M_head_impl[(uint)selected].value * 1.5;
    auVar5 = vfmadd213sd_fma(auVar23,auVar19,auVar7);
    lVar14 = 0;
    do {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->id + lVar14);
      if (*(int *)((long)&prVar3->f + lVar14) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar20 = pdVar13[lVar11] - auVar5._0_8_;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar13 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar20 = auVar5._0_8_ + pdVar13[lVar11];
      }
      pdVar13[lVar11] = dVar20;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)(uint)r_size << 4 != lVar14);
  }
  bVar9 = is_valid_constraint<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
                    (slv,k,x);
  if (!bVar9) {
    affect<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
              ();
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  uVar10 = vmovmskpd_avx(auVar8);
  return (bool)((byte)((byte)(((ulong)uVar10 << 0x3f) >> 0x38) ^
                      (byte)((ulong)(slv->pi)._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl[k] >> 0x38)
                      ) >> 7);
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}